

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_writable_flags(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_6;
  int64_t eval_b_7;
  uv_shutdown_t shutdown_req;
  sockaddr_in addr;
  uv_write_t write_req;
  undefined1 local_e8 [16];
  uv_tcp_t server;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_b_6 = (int64_t)iVar1;
  write_req.data = (void *)0x0;
  server.data = (void *)eval_b_6;
  if ((void *)eval_b_6 == (void *)0x0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    write_req.data = (void *)(long)iVar1;
    shutdown_req.data = (void *)0x0;
    if (write_req.data == (void *)0x0) {
      iVar1 = uv_tcp_bind(&server,&addr,0);
      write_req.data = (void *)(long)iVar1;
      shutdown_req.data = (void *)0x0;
      if (write_req.data == (void *)0x0) {
        iVar1 = uv_listen(&server,0x80,0);
        write_req.data = (void *)(long)iVar1;
        shutdown_req.data = (void *)0x0;
        if (write_req.data == (void *)0x0) {
          iVar1 = uv_is_writable(&server);
          write_req.data = (void *)(long)iVar1;
          shutdown_req.data = (void *)0x0;
          if (write_req.data == (void *)0x0) {
            iVar1 = uv_is_readable(&server);
            write_req.data = (void *)(long)iVar1;
            shutdown_req.data = (void *)0x0;
            if (write_req.data == (void *)0x0) {
              local_e8 = uv_buf_init("PING",4);
              iVar1 = uv_write(&write_req,&server,local_e8,1,0);
              shutdown_req.data = (void *)(long)iVar1;
              if (shutdown_req.data == (void *)0xffffffffffffffe0) {
                iVar1 = uv_shutdown(&shutdown_req,&server,0);
                eval_b_6 = (int64_t)iVar1;
                eval_b_7 = -0x6b;
                if ((void *)eval_b_6 == (void *)0xffffffffffffff95) {
                  iVar1 = uv_read_start(&server,abort);
                  eval_b_6 = (int64_t)iVar1;
                  eval_b_7 = -0x6b;
                  if ((void *)eval_b_6 == (void *)0xffffffffffffff95) {
                    uv_close(&server,close_cb);
                    uVar2 = uv_default_loop();
                    uv_run(uVar2,0);
                    eval_b_6 = 1;
                    eval_b_7 = (int64_t)close_cb_called;
                    if (eval_b_7 == 1) {
                      loop = (uv_loop_t *)uv_default_loop();
                      close_loop(loop);
                      eval_b_6 = 0;
                      uVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(uVar2);
                      eval_b_7 = (int64_t)iVar1;
                      if (eval_b_7 == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar4 = "uv_loop_close(uv_default_loop())";
                      pcVar3 = "0";
                      uVar2 = 0x129;
                    }
                    else {
                      pcVar4 = "close_cb_called";
                      pcVar3 = "1";
                      uVar2 = 0x127;
                    }
                  }
                  else {
                    pcVar4 = "UV_ENOTCONN";
                    pcVar3 = "r";
                    uVar2 = 0x121;
                  }
                }
                else {
                  pcVar4 = "UV_ENOTCONN";
                  pcVar3 = "r";
                  uVar2 = 0x11d;
                }
              }
              else {
                pcVar4 = "UV_EPIPE";
                pcVar3 = "r";
                uVar2 = 0x11b;
                eval_b_7 = -0x20;
                eval_b_6 = (int64_t)shutdown_req.data;
              }
              goto LAB_0018242e;
            }
            pcVar3 = "uv_is_readable((uv_stream_t*) &server)";
            uVar2 = 0x117;
          }
          else {
            pcVar3 = "uv_is_writable((uv_stream_t*) &server)";
            uVar2 = 0x116;
          }
        }
        else {
          pcVar3 = "r";
          uVar2 = 0x114;
        }
      }
      else {
        pcVar3 = "r";
        uVar2 = 0x112;
      }
    }
    else {
      pcVar3 = "r";
      uVar2 = 0x110;
    }
    shutdown_req.data = (void *)0x0;
    pcVar4 = "0";
    eval_b_7 = 0;
    eval_b_6 = (int64_t)write_req.data;
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar2 = 0x10e;
    eval_b_7 = 0;
  }
LAB_0018242e:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_6,"==",eval_b_7);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_writable_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_buf_t buf;
  uv_write_t write_req;
  uv_shutdown_t shutdown_req;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT_OK(r);

  ASSERT_OK(uv_is_writable((uv_stream_t*) &server));
  ASSERT_OK(uv_is_readable((uv_stream_t*) &server));

  buf = uv_buf_init("PING", 4);
  r = uv_write(&write_req, (uv_stream_t*) &server, &buf, 1, NULL);
  ASSERT_EQ(r, UV_EPIPE);
  r = uv_shutdown(&shutdown_req, (uv_stream_t*) &server, NULL);
  ASSERT_EQ(r, UV_ENOTCONN);
  r = uv_read_start((uv_stream_t*) &server,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_EQ(r, UV_ENOTCONN);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}